

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformationImplementation::ExtractValueFromCpuInfoFile
          (string *__return_storage_ptr__,SystemInformationImplementation *this,string *buffer,
          char *word,size_t init)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  allocator<char> local_75 [13];
  string local_68;
  ulong local_48;
  size_t i;
  size_t pos2;
  size_t pos;
  size_t init_local;
  char *word_local;
  string *buffer_local;
  SystemInformationImplementation *this_local;
  
  pos = init;
  init_local = (size_t)word;
  word_local = (char *)buffer;
  buffer_local = (string *)this;
  this_local = (SystemInformationImplementation *)__return_storage_ptr__;
  pos2 = std::__cxx11::string::find((char *)buffer,(ulong)word);
  if (pos2 != 0xffffffffffffffff) {
    this->CurrentPositionInFile = pos2;
    pos2 = std::__cxx11::string::find((char *)buffer,0x7c977d);
    i = std::__cxx11::string::find((char *)buffer,0x7e9929);
    if ((pos2 != 0xffffffffffffffff) && (i != 0xffffffffffffffff)) {
      sVar1 = this->CurrentPositionInFile;
      sVar2 = strlen((char *)init_local);
      local_48 = sVar1 + sVar2;
      while( true ) {
        if (pos2 <= local_48) {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)buffer);
          return __return_storage_ptr__;
        }
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)buffer);
        if ((*pcVar3 != ' ') &&
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)buffer), *pcVar3 != '\t'))
        break;
        local_48 = local_48 + 1;
      }
      std::__cxx11::string::string((string *)&local_68,(string *)buffer);
      ExtractValueFromCpuInfoFile(__return_storage_ptr__,this,&local_68,(char *)init_local,i);
      std::__cxx11::string::~string((string *)&local_68);
      return __return_storage_ptr__;
    }
  }
  this->CurrentPositionInFile = 0xffffffffffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_75);
  std::allocator<char>::~allocator(local_75);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ExtractValueFromCpuInfoFile(
  std::string buffer, const char* word, size_t init)
{
  size_t pos = buffer.find(word, init);
  if (pos != std::string::npos) {
    this->CurrentPositionInFile = pos;
    pos = buffer.find(":", pos);
    size_t pos2 = buffer.find("\n", pos);
    if (pos != std::string::npos && pos2 != std::string::npos) {
      // It may happen that the beginning matches, but this is still not the
      // requested key.
      // An example is looking for "cpu" when "cpu family" comes first. So we
      // check that
      // we have only spaces from here to pos, otherwise we search again.
      for (size_t i = this->CurrentPositionInFile + strlen(word); i < pos;
           ++i) {
        if (buffer[i] != ' ' && buffer[i] != '\t') {
          return this->ExtractValueFromCpuInfoFile(buffer, word, pos2);
        }
      }
      return buffer.substr(pos + 2, pos2 - pos - 2);
    }
  }
  this->CurrentPositionInFile = std::string::npos;
  return "";
}